

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void UYVYToARGBRow_C(uint8_t *src_uyvy,uint8_t *rgb_buf,YuvConstants *yuvconstants,int width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < width + -1; lVar1 = lVar1 + 2) {
    libyuv::YuvPixel(src_uyvy[lVar1 * 2 + 1],src_uyvy[lVar1 * 2],src_uyvy[lVar1 * 2 + 2],rgb_buf,
                     rgb_buf + 1,rgb_buf + 2,yuvconstants);
    rgb_buf[3] = 0xff;
    libyuv::YuvPixel(src_uyvy[lVar1 * 2 + 3],src_uyvy[lVar1 * 2],src_uyvy[lVar1 * 2 + 2],rgb_buf + 4
                     ,rgb_buf + 5,rgb_buf + 6,yuvconstants);
    rgb_buf[7] = 0xff;
    rgb_buf = rgb_buf + 8;
  }
  if ((width & 1U) != 0) {
    libyuv::YuvPixel(src_uyvy[lVar1 * 2 + 1],src_uyvy[lVar1 * 2],src_uyvy[lVar1 * 2 + 2],rgb_buf,
                     rgb_buf + 1,rgb_buf + 2,yuvconstants);
    rgb_buf[3] = 0xff;
  }
  return;
}

Assistant:

void UYVYToARGBRow_C(const uint8_t* src_uyvy,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_uyvy[1], src_uyvy[0], src_uyvy[2], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YuvPixel(src_uyvy[3], src_uyvy[0], src_uyvy[2], rgb_buf + 4, rgb_buf + 5,
             rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_uyvy += 4;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_uyvy[1], src_uyvy[0], src_uyvy[2], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}